

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression(cmGeneratorExpressionDAGChecker *this)

{
  bool bVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  bool local_e1;
  string_view property;
  cmGeneratorExpressionDAGChecker *this_local;
  
  pcVar2 = Top(this);
  __x = (basic_string_view<char,_std::char_traits<char>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pcVar2->Property);
  bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
          ::cm::operator____s("LINK_DIRECTORIES",0x10);
  bVar1 = std::operator==(__x,bVar3);
  local_e1 = true;
  if (!bVar1) {
    bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
            ::cm::operator____s("LINK_OPTIONS",0xc);
    bVar1 = std::operator==(__x,bVar3);
    local_e1 = true;
    if (!bVar1) {
      bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("LINK_DEPENDS",0xc);
      bVar1 = std::operator==(__x,bVar3);
      local_e1 = true;
      if (!bVar1) {
        bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("LINK_LIBRARY_OVERRIDE",0x15);
        local_e1 = std::operator==(__x,bVar3);
      }
    }
  }
  return local_e1;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkExpression() const
{
  cm::string_view property(this->Top()->Property);

  return property == "LINK_DIRECTORIES"_s || property == "LINK_OPTIONS"_s ||
    property == "LINK_DEPENDS"_s || property == "LINK_LIBRARY_OVERRIDE"_s;
}